

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O3

define_directive * get_define_directive(token *macro_name)

{
  define_directive *pdVar1;
  Queue *q;
  Map *tree;
  
  pdVar1 = (define_directive *)malloc(0x30);
  pdVar1->macro_name = macro_name;
  q = (Queue *)malloc(0x18);
  pdVar1->macro_tokens = q;
  Queue_Init(q);
  tree = (Map *)malloc(0x810);
  pdVar1->arguments = tree;
  Map_Init(tree);
  pdVar1->number_of_arguments = 0;
  return pdVar1;
}

Assistant:

struct define_directive* get_define_directive(struct token* macro_name)
{
	struct define_directive *ret;
	ret=malloc(sizeof(struct token));
	ret->macro_name=macro_name;

	ret->macro_tokens=malloc(sizeof(struct Queue));
	Queue_Init(ret->macro_tokens);

	ret->arguments=malloc(sizeof(struct Map));
	Map_Init(ret->arguments);

	ret->number_of_arguments=0;

	return ret;
}